

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O0

void __thiscall bloaty::dwarf::AbbrevTable::ReadAbbrevs(AbbrevTable *this,string_view data)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  const_pointer pvVar3;
  Arg *in_RDI;
  Attribute attr;
  uint8_t has_child;
  Abbrev *abbrev;
  uint32_t code;
  char *start;
  key_type *in_stack_fffffffffffffea8;
  string_view *in_stack_fffffffffffffeb0;
  value_type *in_stack_fffffffffffffeb8;
  uint value;
  int line;
  Arg *in_stack_fffffffffffffec0;
  char *str;
  Arg *in_stack_fffffffffffffed8;
  const_pointer __str;
  undefined2 in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeea;
  undefined4 in_stack_fffffffffffffeec;
  string_view in_stack_fffffffffffffef0;
  char local_68 [39];
  uchar local_41;
  mapped_type *local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  uint local_24;
  const_pointer local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_20 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
  while( true ) {
    local_24 = ReadLEB128<unsigned_int>(&in_stack_fffffffffffffec0->piece_);
    if (local_24 == 0) {
      __str = local_20;
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_38,__str,(long)pvVar3 - (long)local_20);
      in_RDI[1].piece_._M_str = (char *)local_38._M_len;
      *(char **)in_RDI[1].scratch_ = local_38._M_str;
      return;
    }
    local_40 = std::
               unordered_map<unsigned_int,_bloaty::dwarf::AbbrevTable::Abbrev,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bloaty::dwarf::AbbrevTable::Abbrev>_>_>
               ::operator[]((unordered_map<unsigned_int,_bloaty::dwarf::AbbrevTable::Abbrev,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bloaty::dwarf::AbbrevTable::Abbrev>_>_>
                             *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    if (local_40->code != 0) break;
    local_40->code = local_24;
    uVar1 = ReadLEB128<unsigned_short>(&in_stack_fffffffffffffec0->piece_);
    local_40->tag = uVar1;
    local_41 = ReadFixed<unsigned_char,1ul>(in_stack_fffffffffffffeb0);
    if (local_41 == '\0') {
      local_40->has_child = false;
    }
    else {
      if (local_41 != '\x01') {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&in_stack_fffffffffffffec0->piece_,(char *)in_stack_fffffffffffffeb8);
        value = (uint)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
        absl::substitute_internal::Arg::Arg(in_stack_fffffffffffffec0,value);
        absl::substitute_internal::Arg::Arg(in_stack_fffffffffffffec0,value);
        line = (int)((ulong)&stack0xfffffffffffffef8 >> 0x20);
        absl::substitute_internal::Arg::Arg
                  (in_stack_fffffffffffffec0,
                   (unsigned_short)((ulong)&stack0xfffffffffffffef8 >> 0x30));
        str = local_68;
        absl::Substitute_abi_cxx11_
                  (in_stack_fffffffffffffef0,
                   (Arg *)CONCAT44(in_stack_fffffffffffffeec,
                                   CONCAT22(in_stack_fffffffffffffeea,in_stack_fffffffffffffee8)),
                   in_RDI,in_stack_fffffffffffffed8);
        std::__cxx11::string::c_str();
        Throw(str,line);
      }
      local_40->has_child = true;
    }
    while( true ) {
      uVar1 = ReadLEB128<unsigned_short>(&in_stack_fffffffffffffec0->piece_);
      uVar2 = ReadLEB128<unsigned_short>(&in_stack_fffffffffffffec0->piece_);
      if ((uVar1 == 0) && (uVar2 == 0)) break;
      if (uVar2 == 0x21) {
        ReadLEB128<long>(&in_stack_fffffffffffffec0->piece_);
      }
      std::
      vector<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
      ::push_back((vector<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                   *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
    in_stack_fffffffffffffee8 = 0;
    in_stack_fffffffffffffeea = 0;
  }
  Throw((char *)in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
}

Assistant:

void AbbrevTable::ReadAbbrevs(string_view data) {
  const char* start = data.data();
  while (true) {
    uint32_t code = ReadLEB128<uint32_t>(&data);

    if (code == 0) {
      abbrev_data_ = string_view(start, data.data() - start);
      return;
    }

    Abbrev& abbrev = abbrev_[code];

    if (abbrev.code) {
      THROW("DWARF data contained duplicate abbrev code");
    }

    uint8_t has_child;

    abbrev.code = code;
    abbrev.tag = ReadLEB128<uint16_t>(&data);
    has_child = ReadFixed<uint8_t>(&data);

    switch (has_child) {
      case DW_children_yes:
        abbrev.has_child = true;
        break;
      case DW_children_no:
        abbrev.has_child = false;
        break;
      default:
        THROWF("DWARF has_child is neither true nor false: $0, code=$1, tag=$2",
               has_child, abbrev.code, abbrev.tag);
    }

    while (true) {
      Attribute attr;
      attr.name = ReadLEB128<uint16_t>(&data);
      attr.form = ReadLEB128<uint16_t>(&data);

      if (attr.name == 0 && attr.form == 0) {
        break;  // End of this abbrev
      }
      if (attr.form == DW_FORM_implicit_const) {
        // We don't use the constant value, just discard it.
        ReadLEB128<int64_t>(&data);
      }
      abbrev.attr.push_back(attr);
    }
  }
}